

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdEmuCelsiusWeightEnable::emulate_mthd(MthdEmuCelsiusWeightEnable *this)

{
  _Bool _Var1;
  uint local_14;
  uint32_t err;
  MthdEmuCelsiusWeightEnable *this_local;
  
  local_14 = (uint)(1 < (this->super_SingleMthdTest).super_MthdTest.val);
  _Var1 = pgraph_in_begin_end(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (_Var1) {
    local_14 = local_14 | 4;
  }
  if (local_14 == 0) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_b & 0xe3ffffff |
           ((this->super_SingleMthdTest).super_MthdTest.val & 7) << 0x1a;
      pgraph_flush_xf_mode(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t err = 0;
		if (val > 1)
			err |= 1;
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				insrt(exp.xf_mode_b, 26, 3, val);
				pgraph_flush_xf_mode(&exp);
			}
		}
	}